

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O0

set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> * __thiscall
mir::inst::OpInst::useVars(OpInst *this)

{
  char *pcVar1;
  VarId *__s;
  int __c;
  int extraout_EDX;
  int __c_00;
  long in_RSI;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *in_RDI;
  pair<std::_Rb_tree_const_iterator<mir::inst::VarId>,_bool> pVar2;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *s;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  _Rb_tree_const_iterator<mir::inst::VarId> in_stack_ffffffffffffff90;
  
  __s = (VarId *)0x0;
  memset(in_RDI,0,0x30);
  std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::set
            ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)0x2bffbf);
  pcVar1 = std::variant<int,_mir::inst::VarId>::index
                     ((variant<int,_mir::inst::VarId> *)(in_RSI + 0x20),(char *)__s,__c);
  __c_00 = extraout_EDX;
  if (pcVar1 == (char *)0x1) {
    __s = std::get<mir::inst::VarId,int,mir::inst::VarId>
                    ((variant<int,_mir::inst::VarId> *)0x2bffe5);
    pVar2 = std::
            set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
            insert((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    *)in_stack_ffffffffffffff90._M_node,
                   (value_type *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    __c_00 = pVar2._8_4_;
    in_stack_ffffffffffffff90 = pVar2.first._M_node;
    in_stack_ffffffffffffff8f = pVar2.second;
  }
  pcVar1 = std::variant<int,_mir::inst::VarId>::index
                     ((variant<int,_mir::inst::VarId> *)(in_RSI + 0x40),(char *)__s,__c_00);
  if (pcVar1 == (char *)0x1) {
    std::get<mir::inst::VarId,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x2c005d);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
    insert((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *)
           in_stack_ffffffffffffff90._M_node,
           (value_type *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  }
  return in_RDI;
}

Assistant:

std::set<VarId> useVars() const {
    auto s = std::set<VarId>();
    if (lhs.index() == 1) {
      s.insert(std::get<VarId>(lhs));
    }
    if (rhs.index() == 1) {
      s.insert(std::get<VarId>(rhs));
    }
    return s;
  }